

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_add_rel_pos(ggml_compute_params *params,ggml_tensor *dst)

{
  long lVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  size_t __n;
  float *pfVar13;
  float *pfVar14;
  int64_t i11;
  float *pfVar15;
  ulong uVar16;
  long lVar17;
  float *pfVar18;
  ulong uVar19;
  int64_t i10;
  long lVar20;
  ulong uVar21;
  int64_t j;
  ulong uVar22;
  float *pfVar23;
  long lVar24;
  float *local_90;
  
  if (dst->src[0]->type == GGML_TYPE_F32) {
    pgVar5 = dst->src[1];
    pgVar6 = dst->src[2];
    if (dst->op_params[0] == 0) {
      if (params->ith == 0) {
        pvVar7 = dst->data;
        pvVar8 = dst->src[0]->data;
        __n = ggml_nbytes(dst);
        memcpy(pvVar7,pvVar8,__n);
      }
      ggml_barrier(params->threadpool);
    }
    iVar4 = (int)pgVar5->ne[3];
    uVar9 = pgVar5->ne[0];
    pvVar7 = pgVar5->data;
    pvVar8 = pgVar6->data;
    uVar10 = pgVar5->ne[1];
    uVar11 = pgVar5->ne[2];
    iVar12 = (iVar4 + -1 + params->nth) / params->nth;
    lVar24 = (long)params->ith * (long)iVar12;
    iVar12 = iVar12 + (int)lVar24;
    if (iVar4 <= iVar12) {
      iVar12 = iVar4;
    }
    lVar20 = uVar10 * uVar9 * uVar9;
    lVar17 = lVar20 * uVar11;
    local_90 = (float *)(lVar17 * lVar24 * 4 + (long)dst->data);
    for (; lVar24 < iVar12; lVar24 = lVar24 + 1) {
      pfVar15 = local_90;
      for (uVar19 = 0; uVar19 != (~((long)uVar11 >> 0x3f) & uVar11); uVar19 = uVar19 + 1) {
        pfVar13 = pfVar15;
        for (uVar16 = 0; uVar16 != (~((long)uVar10 >> 0x3f) & uVar10); uVar16 = uVar16 + 1) {
          pfVar14 = pfVar13;
          pfVar23 = pfVar13;
          for (uVar21 = 0; uVar21 != (~((long)uVar9 >> 0x3f) & uVar9); uVar21 = uVar21 + 1) {
            lVar1 = uVar21 + (uVar16 + (uVar19 + lVar24 * uVar11) * uVar10) * uVar9;
            fVar2 = *(float *)((long)pvVar7 + lVar1 * 4);
            fVar3 = *(float *)((long)pvVar8 + lVar1 * 4);
            pfVar18 = pfVar23;
            for (uVar22 = 0; uVar9 != uVar22; uVar22 = uVar22 + 1) {
              pfVar14[uVar22] = fVar3 + pfVar14[uVar22];
              *pfVar18 = fVar2 + *pfVar18;
              pfVar18 = pfVar18 + uVar9;
            }
            pfVar23 = pfVar23 + 1;
            pfVar14 = pfVar14 + uVar9;
          }
          pfVar13 = pfVar13 + uVar9 * uVar9;
        }
        pfVar15 = pfVar15 + lVar20;
      }
      local_90 = local_90 + lVar17;
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,0x1eeb,"fatal error");
}

Assistant:

void ggml_compute_forward_add_rel_pos(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_add_rel_pos_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}